

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O1

int __thiscall
jrtplib::RTPUDPv6Transmitter::ProcessDeleteAcceptIgnoreEntry
          (RTPUDPv6Transmitter *this,in6_addr ip,uint16_t port)

{
  list<unsigned_short,_std::allocator<unsigned_short>_> *plVar1;
  size_t *psVar2;
  uint16_t uVar3;
  PortInfo *pPVar4;
  HashElement *pHVar5;
  _List_node_base *p_Var6;
  int iVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  uint8_t local_38;
  uint8_t uStack_37;
  uint8_t uStack_36;
  uint8_t uStack_35;
  uint8_t uStack_34;
  uint8_t uStack_33;
  uint8_t uStack_32;
  uint8_t uStack_31;
  uint8_t uStack_30;
  uint8_t uStack_2f;
  uint8_t uStack_2e;
  uint8_t uStack_2d;
  undefined4 uStack_2c;
  
  uStack_2c = ip.__in6_u._12_4_;
  pHVar5 = (this->acceptignoreinfo).table
           [(uStack_2c >> 0x18 | (uStack_2c & 0xff0000) >> 8 | (uStack_2c & 0xff00) << 8 |
            uStack_2c << 0x18) % 0x207d];
  (this->acceptignoreinfo).curhashelem = pHVar5;
  bVar8 = false;
  do {
    if (pHVar5 == (HashElement *)0x0) break;
    local_38 = ip.__in6_u._0_1_;
    uStack_37 = ip.__in6_u._1_1_;
    uStack_36 = ip.__in6_u._2_1_;
    uStack_35 = ip.__in6_u._3_1_;
    uStack_34 = ip.__in6_u._4_1_;
    uStack_33 = ip.__in6_u._5_1_;
    uStack_32 = ip.__in6_u._6_1_;
    uStack_31 = ip.__in6_u._7_1_;
    uStack_30 = ip.__in6_u._8_1_;
    uStack_2f = ip.__in6_u._9_1_;
    uStack_2e = ip.__in6_u._10_1_;
    uStack_2d = ip.__in6_u._11_1_;
    uStack_2c._0_1_ = ip.__in6_u._12_1_;
    uStack_2c._1_1_ = ip.__in6_u._13_1_;
    uStack_2c._2_1_ = ip.__in6_u._14_1_;
    uStack_2c._3_1_ = ip.__in6_u._15_1_;
    auVar9[0] = -(local_38 == (pHVar5->key).__in6_u.__u6_addr8[0]);
    auVar9[1] = -(uStack_37 == (pHVar5->key).__in6_u.__u6_addr8[1]);
    auVar9[2] = -(uStack_36 == (pHVar5->key).__in6_u.__u6_addr8[2]);
    auVar9[3] = -(uStack_35 == (pHVar5->key).__in6_u.__u6_addr8[3]);
    auVar9[4] = -(uStack_34 == (pHVar5->key).__in6_u.__u6_addr8[4]);
    auVar9[5] = -(uStack_33 == (pHVar5->key).__in6_u.__u6_addr8[5]);
    auVar9[6] = -(uStack_32 == (pHVar5->key).__in6_u.__u6_addr8[6]);
    auVar9[7] = -(uStack_31 == (pHVar5->key).__in6_u.__u6_addr8[7]);
    auVar9[8] = -(uStack_30 == (pHVar5->key).__in6_u.__u6_addr8[8]);
    auVar9[9] = -(uStack_2f == (pHVar5->key).__in6_u.__u6_addr8[9]);
    auVar9[10] = -(uStack_2e == (pHVar5->key).__in6_u.__u6_addr8[10]);
    auVar9[0xb] = -(uStack_2d == (pHVar5->key).__in6_u.__u6_addr8[0xb]);
    auVar9[0xc] = -((uint8_t)uStack_2c == (pHVar5->key).__in6_u.__u6_addr8[0xc]);
    auVar9[0xd] = -(uStack_2c._1_1_ == (pHVar5->key).__in6_u.__u6_addr8[0xd]);
    auVar9[0xe] = -(uStack_2c._2_1_ == (pHVar5->key).__in6_u.__u6_addr8[0xe]);
    auVar9[0xf] = -(uStack_2c._3_1_ == (pHVar5->key).__in6_u.__u6_addr8[0xf]);
    if ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe | (ushort)(auVar9[0xf] >> 7) << 0xf)
        == 0xffff) {
      bVar8 = true;
    }
    else {
      pHVar5 = pHVar5->hashnext;
      (this->acceptignoreinfo).curhashelem = pHVar5;
    }
  } while (!bVar8);
  pHVar5 = (this->acceptignoreinfo).curhashelem;
  iVar7 = -0x6f;
  if (pHVar5 != (HashElement *)0x0) {
    pPVar4 = pHVar5->element;
    if (port == 0) {
      pPVar4->all = false;
      std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::clear(&pPVar4->portlist);
    }
    else {
      plVar1 = &pPVar4->portlist;
      p_Var6 = (_List_node_base *)plVar1;
      if (pPVar4->all == false) {
        do {
          p_Var6 = (((_List_base<unsigned_short,_std::allocator<unsigned_short>_> *)&p_Var6->_M_next
                    )->_M_impl)._M_node.super__List_node_base._M_next;
          if (p_Var6 == (_List_node_base *)plVar1) {
            return -0x6f;
          }
        } while (*(uint16_t *)&p_Var6[1]._M_next != port);
        psVar2 = &(pPVar4->portlist).
                  super__List_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl._M_node.
                  _M_size;
        *psVar2 = *psVar2 - 1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(p_Var6,0x18);
      }
      else {
        p_Var6 = (plVar1->super__List_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl
                 ._M_node.super__List_node_base._M_next;
        bVar8 = p_Var6 == (_List_node_base *)plVar1;
        if (bVar8) {
LAB_0012572f:
          p_Var6 = (_List_node_base *)operator_new(0x18);
          *(uint16_t *)&p_Var6[1]._M_next = port;
          std::__detail::_List_node_base::_M_hook(p_Var6);
          psVar2 = &(pPVar4->portlist).
                    super__List_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                    _M_node._M_size;
          *psVar2 = *psVar2 + 1;
        }
        else {
          uVar3 = *(uint16_t *)&p_Var6[1]._M_next;
          while (uVar3 != port) {
            p_Var6 = p_Var6->_M_next;
            bVar8 = p_Var6 == (_List_node_base *)plVar1;
            if (bVar8) goto LAB_0012572f;
            uVar3 = *(uint16_t *)&p_Var6[1]._M_next;
          }
        }
        if (!bVar8) {
          return -0x6f;
        }
      }
    }
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

int RTPUDPv6Transmitter::ProcessDeleteAcceptIgnoreEntry(in6_addr ip,uint16_t port)
{
	acceptignoreinfo.GotoElement(ip);
	if (!acceptignoreinfo.HasCurrentElement())
		return ERR_RTP_UDPV6TRANS_NOSUCHENTRY;
	
	PortInfo *inf;

	inf = acceptignoreinfo.GetCurrentElement();
	if (port == 0) // delete all entries
	{
		inf->all = false;
		inf->portlist.clear();
	}
	else // a specific port was selected
	{
		if (inf->all) // currently, all ports are selected. Add the one to remove to the list
		{
			// we have to check if the list doesn't contain the port already
			std::list<uint16_t>::const_iterator it,begin,end;

			begin = inf->portlist.begin();
			end = inf->portlist.end();
			for (it = begin ; it != end ; it++)
			{
				if (*it == port) // already in list: this means we already deleted the entry
					return ERR_RTP_UDPV6TRANS_NOSUCHENTRY;
			}
			inf->portlist.push_front(port);
		}
		else // check if we can find the port in the list
		{
			std::list<uint16_t>::iterator it,begin,end;
			
			begin = inf->portlist.begin();
			end = inf->portlist.end();
			for (it = begin ; it != end ; ++it)
			{
				if (*it == port) // found it!
				{
					inf->portlist.erase(it);
					return 0;
				}
			}
			// didn't find it
			return ERR_RTP_UDPV6TRANS_NOSUCHENTRY;			
		}
	}
	return 0;
}